

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void __thiscall hgdb::json::Variable::serialize(Variable *this,JSONWriter *w)

{
  bool bVar1;
  JSONWriter *pJVar2;
  unsigned_long *puVar3;
  string local_c8;
  string_view local_a8;
  string_view local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string_view local_68 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string_view local_28;
  JSONWriter *local_18;
  JSONWriter *w_local;
  Variable *this_local;
  
  local_18 = w;
  w_local = (JSONWriter *)this;
  pJVar2 = JSONWriter::begin_obj(w);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"name");
  pJVar2 = JSONWriter::key(pJVar2,local_28);
  std::__cxx11::string::string((string *)&local_48,(string *)this);
  pJVar2 = JSONWriter::value<std::__cxx11::string>(pJVar2,&local_48);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_68,"value");
  pJVar2 = JSONWriter::key(pJVar2,local_68[0]);
  std::__cxx11::string::string((string *)&local_88,(string *)&this->value);
  pJVar2 = JSONWriter::value<std::__cxx11::string>(pJVar2,&local_88);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"rtl");
  pJVar2 = JSONWriter::key(pJVar2,local_98);
  JSONWriter::value<bool>(pJVar2,(bool)(this->rtl & 1));
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->id);
  pJVar2 = local_18;
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"id");
    pJVar2 = JSONWriter::key(pJVar2,local_a8);
    puVar3 = std::optional<unsigned_long>::operator*(&this->id);
    std::__cxx11::to_string(&local_c8,*puVar3);
    JSONWriter::value<std::__cxx11::string>(pJVar2,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  JSONWriter::end_obj(local_18);
  return;
}

Assistant:

void serialize(JSONWriter &w) const {
        w.begin_obj().key("name").value(name).key("value").value(value).key("rtl").value(rtl);
        if (id) {
            w.key("id").value(std::to_string(*id));
        }
        w.end_obj();
    }